

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

void __thiscall
QNetworkAccessManager::connectToHost(QNetworkAccessManager *this,QString *hostName,quint16 port)

{
  long lVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QNetworkRequest request;
  QUrl url;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&url);
  QUrl::setHost((QString *)&url,(ParsingMode)hostName);
  QUrl::setPort((int)&url);
  latin1.m_data = "preconnect-http";
  latin1.m_size = 0xf;
  QString::QString((QString *)&request,latin1);
  QUrl::setScheme((QString *)&url);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&request);
  request.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest(&request,&url);
  get(this,&request);
  QNetworkRequest::~QNetworkRequest(&request);
  QUrl::~QUrl(&url);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManager::connectToHost(const QString &hostName, quint16 port)
{
    QUrl url;
    url.setHost(hostName);
    url.setPort(port);
    url.setScheme("preconnect-http"_L1);
    QNetworkRequest request(url);
    get(request);
}